

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_multiple.h
# Opt level: O1

bool __thiscall
density::detail::
LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_density::default_busy_wait>_>
::Consume::begin_iteration
          (Consume *this,
          LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
          *i_queue)

{
  atomic<unsigned_long> *paVar1;
  long *plVar2;
  __pointer_type pLVar3;
  __pointer_type pLVar4;
  ulong uVar5;
  uintptr_t uint_pointer;
  __pointer_type pLVar6;
  long in_FS_OFFSET;
  bool bVar7;
  
  pLVar6 = (i_queue->m_head)._M_b._M_p;
  if (pLVar6 == (__pointer_type)0x0) {
    pLVar6 = (i_queue->m_head)._M_b._M_p;
    if (pLVar6 == (__pointer_type)0x0) {
      pLVar3 = *(__pointer_type *)
                &(i_queue->
                 super_LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                 ).field_0x50;
      LOCK();
      pLVar4 = (i_queue->m_head)._M_b._M_p;
      bVar7 = pLVar4 == (__pointer_type)0x0;
      if (bVar7) {
        (i_queue->m_head)._M_b._M_p = pLVar3;
        pLVar4 = pLVar6;
      }
      UNLOCK();
      pLVar6 = pLVar4;
      if (bVar7) {
        pLVar6 = pLVar3;
      }
    }
    if (pLVar6 == (__pointer_type)0x0) {
      *(undefined8 *)(this + 0x10) = 0;
      return true;
    }
  }
  uVar5 = *(ulong *)(this + 8) ^ (ulong)pLVar6;
  while (0xff < uVar5) {
    LOCK();
    paVar1 = &(i_queue->
              super_LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
              ).
              super_LFQueue_Base<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
              .super_UnmovableFastTestAllocator<65536UL>.m_living_pins;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    PageAllocator<density::detail::SystemPageManager<256ul>>::t_instance::__tls_init();
    if (*(long *)(in_FS_OFFSET + -0x30) != 0) {
      PageAllocator<density::detail::SystemPageManager<256UL>_>::process_pending_unpins_impl
                (progress_lock_free);
    }
    LOCK();
    plVar2 = (long *)(((ulong)pLVar6 & 0xffffffffffffff00) + 0xf8);
    *plVar2 = *plVar2 + 1;
    UNLOCK();
    if (*(void **)(this + 8) != (void *)0x0) {
      density_tests::UnmovableFastTestAllocator<256UL>::unpin_page
                ((UnmovableFastTestAllocator<256UL> *)i_queue,*(void **)(this + 8));
    }
    *(__pointer_type *)(this + 8) = pLVar6;
    pLVar6 = (i_queue->m_head)._M_b._M_p;
    uVar5 = *(ulong *)(this + 8) ^ (ulong)pLVar6;
  }
  *(LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
    **)this = i_queue;
  *(__pointer_type *)(this + 8) = pLVar6;
  *(uintptr_t *)(this + 0x10) = pLVar6->m_next;
  bVar7 = empty(this);
  if ((!bVar7) && (*(ulong *)(this + 0x10) < 0x100)) {
    density_tests::detail::assert_failed<>
              ("empty() || m_next_ptr >= ALLOCATOR_TYPE::page_alignment",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
               ,0xb4);
  }
  return true;
}

Assistant:

bool begin_iteration(LFQueue_Head * i_queue) noexcept
                {
                    DENSITY_ASSUME_ALIGNED(m_control, Base::s_alloc_granularity);

                    ControlBlock * head = i_queue->m_head.load();
                    DENSITY_ASSUME_ALIGNED(head, Base::s_alloc_granularity);

                    if (head == nullptr)
                    {
                        head = init_head(i_queue);
                        if (head == nullptr)
                        {
                            m_next_ptr = 0;
                            return true;
                        }
                    }

                    while (!Base::same_page(m_control, head))
                    {
                        DENSITY_ASSUME(m_control != head);

                        i_queue->ALLOCATOR_TYPE::pin_page(head);

                        if (m_control != nullptr)
                        {
                            i_queue->ALLOCATOR_TYPE::unpin_page(m_control);
                        }

                        m_control = head;

                        head = i_queue->m_head.load();
                        DENSITY_ASSUME_ALIGNED(head, Base::s_alloc_granularity);
                    }

                    m_queue    = i_queue;
                    m_control  = static_cast<ControlBlock *>(head);
                    m_next_ptr = raw_atomic_load(&m_control->m_next, mem_relaxed);
                    DENSITY_ASSERT_INTERNAL(
                      empty() || m_next_ptr >= ALLOCATOR_TYPE::page_alignment);
                    return true;
                }